

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

_Bool copy_active_tensor_to_branches
                (TENSOR *layer_active_tensor,CNN_LAYER_CONFIG *layer_config,int branch,
                TENSOR *branch_output)

{
  _Bool _Var1;
  int channels;
  ulong uVar2;
  _Bool _Var3;
  
  uVar2 = 0;
  _Var3 = false;
  do {
    if (((uint)branch != uVar2) &&
       ((1 << ((byte)uVar2 & 0x1f) & (layer_config->branch_config).input_to_branches) != 0)) {
      channels = (layer_config->branch_config).channels_to_copy;
      if (channels < 1) {
        channels = layer_active_tensor->channels;
      }
      _Var1 = realloc_tensor(branch_output,channels,layer_active_tensor->width,
                             layer_active_tensor->height);
      if (!_Var1) {
        return _Var3;
      }
      copy_tensor(layer_active_tensor,channels,0,branch_output);
    }
    _Var3 = 2 < uVar2;
    uVar2 = uVar2 + 1;
    branch_output = branch_output + 1;
    if (uVar2 == 4) {
      return _Var3;
    }
  } while( true );
}

Assistant:

static bool copy_active_tensor_to_branches(const TENSOR *layer_active_tensor,
                                           const CNN_LAYER_CONFIG *layer_config,
                                           int branch, TENSOR branch_output[]) {
  const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    if ((branch_config->input_to_branches & (1 << b)) && b != branch) {
      // Copy layer's active tensor to output tensor of branch b if set in
      // mask. The output becomes the input of the first layer of the branch
      // because the layer of the branch is not the first layer.
      int copy_channels = branch_config->channels_to_copy > 0
                              ? branch_config->channels_to_copy
                              : layer_active_tensor->channels;
      if (!realloc_tensor(&branch_output[b], copy_channels,
                          layer_active_tensor->width,
                          layer_active_tensor->height)) {
        return false;
      }
      copy_tensor(layer_active_tensor, copy_channels, 0, &branch_output[b]);
    }
  }
  return true;
}